

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::_isRefinementOver
          (SoPlexBase<double> *this,bool *primalFeasible,bool *dualFeasible,
          Rational *boundsViolation,Rational *sideViolation,Rational *redCostViolation,
          Rational *dualViolation,int minIRRoundsRemaining,bool *stoppedTime,bool *stoppedIter,
          int numFailedRefinements)

{
  type_conflict5 tVar1;
  bool bVar2;
  Verbosity VVar3;
  bool *in_RCX;
  SoPlexBase<double> *in_RDX;
  byte *in_RSI;
  long in_RDI;
  bool *in_R8;
  int in_stack_00000010;
  Verbosity old_verbosity_1;
  int in_stack_00000028;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar4;
  type_conflict5 local_49;
  Verbosity local_48;
  Verbosity local_44 [5];
  bool local_1;
  
  tVar1 = boost::multiprecision::operator<=
                    (in_stack_ffffffffffffff98,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)0x4325fd);
  local_49 = false;
  if (tVar1) {
    local_49 = boost::multiprecision::operator<=
                         (in_stack_ffffffffffffff98,
                          (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                           *)0x432622);
  }
  *in_RSI = local_49;
  tVar1 = boost::multiprecision::operator<=
                    (in_stack_ffffffffffffff98,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)0x43264a);
  uVar4 = false;
  if (tVar1) {
    uVar4 = boost::multiprecision::operator<=
                      (in_stack_ffffffffffffff98,
                       (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                        *)0x43266f);
  }
  *(undefined1 *)&in_RDX->_vptr_SoPlexBase = uVar4;
  if (((*in_RSI & 1) != 0) && (((ulong)in_RDX->_vptr_SoPlexBase & 1) != 0)) {
    if (in_stack_00000010 < 0) {
      if ((in_RDI != -8) && (VVar3 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar3))
      {
        local_44[2] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
        local_44[1] = 3;
        SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_44 + 1);
        soplex::operator<<((SPxOut *)CONCAT17(uVar4,in_stack_ffffffffffffffa0),
                           (char *)in_stack_ffffffffffffff98);
        SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_44 + 2);
      }
      return true;
    }
    if ((in_RDI != -8) && (VVar3 = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8)), 2 < (int)VVar3)) {
      local_44[0] = SPxOut::getVerbosity((SPxOut *)(in_RDI + 8));
      local_48 = INFO1;
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),&local_48);
      soplex::operator<<((SPxOut *)CONCAT17(uVar4,in_stack_ffffffffffffffa0),
                         (char *)in_stack_ffffffffffffff98);
      SPxOut::setVerbosity((SPxOut *)(in_RDI + 8),local_44);
    }
  }
  bVar2 = _isSolveStopped(in_RDX,in_RCX,in_R8);
  if ((bVar2) || (2 < in_stack_00000028)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::_isRefinementOver(
   bool& primalFeasible,
   bool& dualFeasible,
   Rational& boundsViolation,
   Rational& sideViolation,
   Rational& redCostViolation,
   Rational& dualViolation,
   int minIRRoundsRemaining,
   bool& stoppedTime,
   bool& stoppedIter,
   int numFailedRefinements)
{
   // terminate if tolerances are satisfied
   primalFeasible = (boundsViolation <= _rationalFeastol && sideViolation <= _rationalFeastol);
   dualFeasible = (redCostViolation <= _rationalOpttol && dualViolation <= _rationalOpttol);

   if(primalFeasible && dualFeasible)
   {
      if(minIRRoundsRemaining < 0)
      {
         SPX_MSG_INFO1(spxout, spxout << "Tolerances reached.\n");
         return true;
      }
      else
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Tolerances reached but minIRRoundsRemaining forcing additional refinement rounds.\n");
      }
   }

   // terminate if some limit is reached
   if(_isSolveStopped(stoppedTime, stoppedIter) || numFailedRefinements > 2)
      return true;

   return false;
}